

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void __thiscall kratos::InlineGeneratorVisitor::visit(InlineGeneratorVisitor *this,Generator *top)

{
  AssignStmt **value_str;
  element_type *peVar1;
  Generator *this_00;
  pointer pcVar2;
  pointer psVar3;
  bool bVar4;
  bool bVar5;
  __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
  _Var6;
  _Base_ptr p_Var7;
  GeneratorException *this_01;
  undefined1 child [8];
  initializer_list<kratos::IRNode_*> __l;
  PortInfo PVar8;
  undefined1 local_e0 [8];
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  child_generators;
  PortInfo res;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
  inline_stmts;
  undefined1 local_60 [32];
  Generator *local_40;
  allocator_type local_31;
  
  Generator::get_child_generators
            ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
              *)local_e0,top);
  psVar3 = child_generators.
           super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((local_e0 !=
       (undefined1  [8])
       child_generators.
       super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
       ._M_impl.super__Vector_impl_data._M_start) &&
     (_Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Generator>*,std::vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>>,__gnu_cxx::__ops::_Iter_negate<kratos::InlineGeneratorVisitor::visit(kratos::Generator*)::_lambda(auto:1_const&)_1_>>
                        (local_e0,child_generators.
                                  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start),
     _Var6._M_current == psVar3)) {
    port_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    inline_stmts.
    super__Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if (local_e0 !=
        (undefined1  [8])
        child_generators.
        super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      bVar5 = false;
      value_str = &res.stmt;
      child = local_e0;
      local_40 = top;
      do {
        while( true ) {
          peVar1 = (((shared_ptr<kratos::Generator> *)child)->
                   super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          res.stmt = (AssignStmt *)&port_names._M_t._M_impl.super__Rb_tree_header;
          std::__cxx11::string::_M_construct<char_const*>((string *)value_str,"inline","");
          bVar4 = IRNode::has_attribute(&peVar1->super_IRNode,(string *)value_str);
          if (res.stmt != (AssignStmt *)&port_names._M_t._M_impl.super__Rb_tree_header) {
            operator_delete(res.stmt,port_names._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
                                     1);
          }
          if (bVar4) break;
          child = (undefined1  [8])((long)child + 0x10);
          if (child == (undefined1  [8])
                       child_generators.
                       super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) {
            if (!bVar5) goto LAB_0021984f;
            goto LAB_0021983a;
          }
        }
        peVar1 = (((shared_ptr<kratos::Generator> *)child)->
                 super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (((peVar1->is_cloned_ != false) ||
            ((peVar1->lib_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (peVar1->lib_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) || ((peVar1->is_external_ & 1U) != 0)) {
          this_01 = (GeneratorException *)__cxa_allocate_exception(0x10);
          res.stmt = (AssignStmt *)&port_names._M_t._M_impl.super__Rb_tree_header;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&res.stmt,"Cannot inline cloned or external modules","");
          child_generators.
          super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)(((shared_ptr<kratos::Generator> *)child)->
                        super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          res._0_8_ = local_40;
          __l._M_len = 2;
          __l._M_array = (iterator)
                         &child_generators.
                          super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)local_60,__l,
                     &local_31);
          GeneratorException::GeneratorException
                    (this_01,(string *)&res.stmt,
                     (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)local_60);
          __cxa_throw(this_01,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)value_str,&(peVar1->ports_)._M_t);
        for (p_Var7 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var7 != (_Rb_tree_node_base *)&port_names;
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
          Generator::get_port((Generator *)local_60,
                              (string *)
                              (((shared_ptr<kratos::Generator> *)child)->
                              super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
          PVar8 = get_port_assignment((Port *)local_60._0_8_);
          res._0_8_ = PVar8.stmt;
          child_generators.
          super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT44(child_generators.
                                 super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 PVar8.direction);
          if ((AssignStmt *)res._0_8_ != (AssignStmt *)0x0) {
            if (inline_stmts.
                super__Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
                ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
              std::
              vector<kratos::InlineGeneratorVisitor::PortInfo,std::allocator<kratos::InlineGeneratorVisitor::PortInfo>>
              ::_M_realloc_insert<kratos::InlineGeneratorVisitor::PortInfo&>
                        ((vector<kratos::InlineGeneratorVisitor::PortInfo,std::allocator<kratos::InlineGeneratorVisitor::PortInfo>>
                          *)&port_names._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (iterator)0x0,
                         (PortInfo *)
                         &child_generators.
                          super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            else {
              *(pointer *)
               inline_stmts.
               super__Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
               ._M_impl.super__Vector_impl_data._M_start =
                   child_generators.
                   super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (inline_stmts.
               super__Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
               ._M_impl.super__Vector_impl_data._M_start)->stmt = (AssignStmt *)res._0_8_;
              inline_stmts.
              super__Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   inline_stmts.
                   super__Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          if ((pointer)local_60._8_8_ != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
          }
        }
        this_00 = (((shared_ptr<kratos::Generator> *)child)->
                  super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_60._0_8_ = local_60 + 0x10;
        pcVar2 = (this_00->instance_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_60,pcVar2,pcVar2 + (this_00->instance_name)._M_string_length);
        std::__cxx11::string::append((char *)local_60);
        Generator::transfer_content(this_00,local_40,(string *)local_60);
        if ((Port *)local_60._0_8_ != (Port *)(local_60 + 0x10)) {
          operator_delete((void *)local_60._0_8_,
                          (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_60._16_8_)->_M_dataplus)._M_p + 1));
        }
        Generator::remove_child_generator(local_40,(shared_ptr<kratos::Generator> *)child);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)value_str);
        child = (undefined1  [8])((long)child + 0x10);
        bVar5 = true;
      } while (child != (undefined1  [8])
                        child_generators.
                        super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
LAB_0021983a:
      optimize_passthrough_assignment
                (local_40,(vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
                           *)&port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
LAB_0021984f:
    if (port_names._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      operator_delete((void *)port_names._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      -port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  std::
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
           *)local_e0);
  return;
}

Assistant:

void visit(Generator* top) override {
        auto child_generators = top->get_child_generators();
        if (child_generators.empty()) return;
        // calculate if we should inline or not
        bool start_inline =
            std::all_of(child_generators.begin(), child_generators.end(),
                        [](auto const& gen) { return gen->get_child_generator_size() == 0; });
        if (!start_inline) return;

        std::vector<PortInfo> inline_stmts;
        bool has_inlined_inst = false;
        for (auto const& child : child_generators) {
            if (!child->has_attribute("inline")) {
                continue;
            }
            if (child->is_cloned() || child->external()) {
                throw GeneratorException("Cannot inline cloned or external modules",
                                         {child.get(), top});
            }
            has_inlined_inst = true;
            // figure out which port we should focus on
            auto port_names = child->get_port_names();
            for (auto const& port_name : port_names) {
                auto const& port = child->get_port(port_name);
                auto res = get_port_assignment(port.get());
                if (res.stmt) {
                    inline_stmts.emplace_back(res);
                }
            }

            child->transfer_content(*top, child->instance_name + "_");
            top->remove_child_generator(child);
        }
        if (has_inlined_inst) {
            optimize_passthrough_assignment(top, inline_stmts);
        }
    }